

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qcssparser.cpp
# Opt level: O0

LengthData __thiscall QCss::ValueExtractor::lengthValue(ValueExtractor *this,Value *v)

{
  QStringView s_00;
  QStringView s_01;
  QStringView s_02;
  bool bVar1;
  char16_t *pcVar2;
  QStringView *this_00;
  int *in_RSI;
  long in_FS_OFFSET;
  LengthData LVar3;
  size_t RuntimeThreshold_2;
  size_t RuntimeThreshold_1;
  size_t RuntimeThreshold;
  size_t i;
  size_t i_1;
  size_t i_2;
  QStringView s;
  QString str;
  LengthData data;
  undefined4 in_stack_fffffffffffffe98;
  undefined4 in_stack_fffffffffffffe9c;
  qsizetype in_stack_fffffffffffffea0;
  QString *in_stack_fffffffffffffea8;
  char16_t *str_00;
  QStringView *in_stack_fffffffffffffeb0;
  qsizetype in_stack_fffffffffffffec0;
  storage_type_conflict *psVar4;
  ulong local_b8;
  ulong local_a0;
  ulong local_88;
  char16_t local_70 [16];
  storage_type_conflict local_50 [8];
  QStringView local_40;
  undefined1 *local_30;
  undefined1 *local_28;
  undefined1 *local_20;
  undefined8 local_18;
  int local_10;
  undefined4 uStack_c;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  local_30 = &DAT_aaaaaaaaaaaaaaaa;
  local_28 = &DAT_aaaaaaaaaaaaaaaa;
  local_20 = &DAT_aaaaaaaaaaaaaaaa;
  ::QVariant::toString();
  local_40.m_size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
  local_40.m_data = (storage_type_conflict *)&DAT_aaaaaaaaaaaaaaaa;
  QStringView::QStringView<QString,_true>(in_stack_fffffffffffffeb0,in_stack_fffffffffffffea8);
  local_18 = 0xffffffffffffffff;
  local_10 = 0;
  uStack_c = 0xaaaaaaaa;
  psVar4 = local_50;
  std::data<char16_t_const,3ul>((char16_t (*) [3])L"px");
  for (local_b8 = 0; (local_b8 < 3 && (L"px"[local_b8] != L'\0')); local_b8 = local_b8 + 1) {
  }
  QStringView::QStringView<char16_t,_true>
            (in_stack_fffffffffffffeb0,(char16_t *)in_stack_fffffffffffffea8,
             in_stack_fffffffffffffea0);
  s_00.m_data = psVar4;
  s_00.m_size = in_stack_fffffffffffffec0;
  bVar1 = QStringView::endsWith
                    ((QStringView *)CONCAT44(in_stack_fffffffffffffe9c,in_stack_fffffffffffffe98),
                     s_00,CaseInsensitive);
  if (bVar1) {
    local_10 = 1;
  }
  else {
    pcVar2 = std::data<char16_t_const,3ul>((char16_t (*) [3])L"ex");
    for (local_a0 = 0; (local_a0 < 3 && (L"ex"[local_a0] != L'\0')); local_a0 = local_a0 + 1) {
    }
    QStringView::QStringView<char16_t,_true>
              (in_stack_fffffffffffffeb0,(char16_t *)in_stack_fffffffffffffea8,
               in_stack_fffffffffffffea0);
    s_01.m_data = psVar4;
    s_01.m_size = (qsizetype)pcVar2;
    bVar1 = QStringView::endsWith
                      ((QStringView *)CONCAT44(in_stack_fffffffffffffe9c,in_stack_fffffffffffffe98),
                       s_01,CaseInsensitive);
    if (bVar1) {
      local_10 = 2;
    }
    else {
      str_00 = local_70;
      this_00 = (QStringView *)std::data<char16_t_const,3ul>((char16_t (*) [3])L"em");
      for (local_88 = 0; (local_88 < 3 && (L"em"[local_88] != L'\0')); local_88 = local_88 + 1) {
      }
      QStringView::QStringView<char16_t,_true>(this_00,str_00,in_stack_fffffffffffffea0);
      s_02.m_data = psVar4;
      s_02.m_size = (qsizetype)pcVar2;
      bVar1 = QStringView::endsWith
                        ((QStringView *)
                         CONCAT44(in_stack_fffffffffffffe9c,in_stack_fffffffffffffe98),s_02,
                         CaseInsensitive);
      if (bVar1) {
        local_10 = 3;
      }
    }
  }
  if (local_10 == 0) {
    if (*in_RSI == 2) {
      local_10 = 4;
    }
  }
  else {
    QStringView::chop(&local_40,2);
  }
  local_18 = QStringView::toDouble((bool *)&local_40);
  QString::~QString((QString *)0xa2d671);
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  LVar3.unit = local_10;
  LVar3.number = (qreal)local_18;
  LVar3._12_4_ = 0;
  return LVar3;
}

Assistant:

LengthData ValueExtractor::lengthValue(const Value& v)
{
    const QString str = v.variant.toString();
    QStringView s(str);
    LengthData data;
    data.unit = LengthData::None;
    if (s.endsWith(u"px", Qt::CaseInsensitive))
        data.unit = LengthData::Px;
    else if (s.endsWith(u"ex", Qt::CaseInsensitive))
        data.unit = LengthData::Ex;
    else if (s.endsWith(u"em", Qt::CaseInsensitive))
        data.unit = LengthData::Em;

    if (data.unit != LengthData::None)
        s.chop(2);
    else if (v.type == Value::Percentage)
        data.unit = LengthData::Percent;

    data.number = s.toDouble();
    return data;
}